

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O0

int Div_FindDiv(Vec_Int_t *vA,Vec_Int_t *vB,int *pLitsA,int *pLitsB)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int *pEndB;
  int *pBegB;
  int *pEndA;
  int *pBegA;
  int Counter;
  int *pLitsB_local;
  int *pLitsA_local;
  Vec_Int_t *vB_local;
  Vec_Int_t *vA_local;
  
  pBegA._4_4_ = 0;
  pEndA = vA->pArray;
  piVar2 = vA->pArray;
  iVar5 = vA->nSize;
  pEndB = vB->pArray;
  piVar3 = vB->pArray;
  iVar1 = vB->nSize;
  pLitsB[1] = -1;
  *pLitsB = -1;
  pLitsA[1] = -1;
  *pLitsA = -1;
  do {
    while( true ) {
      while( true ) {
        if (piVar2 + iVar5 <= pEndA || piVar3 + iVar1 <= pEndB) {
          do {
            if (piVar2 + iVar5 <= pEndA) {
              do {
                if (piVar3 + iVar1 <= pEndB) {
                  return pBegA._4_4_;
                }
                iVar5 = Div_AddLit(*pEndB,pLitsB);
                pEndB = pEndB + 1;
              } while (iVar5 == 0);
              return -1;
            }
            iVar4 = Div_AddLit(*pEndA,pLitsA);
            pEndA = pEndA + 1;
          } while (iVar4 == 0);
          return -1;
        }
        if (*pEndA != *pEndB) break;
        pBegA._4_4_ = pBegA._4_4_ + 1;
        pEndB = pEndB + 1;
        pEndA = pEndA + 1;
      }
      if (*pEndA < *pEndB) break;
      iVar4 = Div_AddLit(*pEndB,pLitsB);
      pEndB = pEndB + 1;
      if (iVar4 != 0) {
        return -1;
      }
    }
    iVar4 = Div_AddLit(*pEndA,pLitsA);
    pEndA = pEndA + 1;
  } while (iVar4 == 0);
  return -1;
}

Assistant:

int Div_FindDiv( Vec_Int_t * vA, Vec_Int_t * vB, int pLitsA[2], int pLitsB[2] )
{
    int Counter = 0;
    int * pBegA = vA->pArray, * pEndA = vA->pArray + vA->nSize;
    int * pBegB = vB->pArray, * pEndB = vB->pArray + vB->nSize; 
    pLitsA[0] = pLitsA[1] = pLitsB[0] = pLitsB[1] = -1;
    while ( pBegA < pEndA && pBegB < pEndB )
    {
        if ( *pBegA == *pBegB )
            pBegA++, pBegB++, Counter++;
        else if ( *pBegA < *pBegB )
        {
            if ( Div_AddLit( *pBegA++, pLitsA ) )
                return -1;
        }
        else  
        {
            if ( Div_AddLit( *pBegB++, pLitsB ) )
                return -1;
        }
    }
    while ( pBegA < pEndA )
        if ( Div_AddLit( *pBegA++, pLitsA ) )
            return -1;
    while ( pBegB < pEndB )
        if ( Div_AddLit( *pBegB++, pLitsB ) )
            return -1;
    return Counter;
}